

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_13::NameApplier::UseNameForVar(NameApplier *this,string_view name,Var *var)

{
  bool bVar1;
  string *psVar2;
  Var *this_00;
  string_view name_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  this_00 = (Var *)name._M_str;
  __x._M_str = (char *)name._M_len;
  if (this_00->type_ == Name) {
    psVar2 = Var::name_abi_cxx11_(this_00);
    __x._M_len = (size_t)this;
    __y._M_str = (psVar2->_M_dataplus)._M_p;
    __y._M_len = psVar2->_M_string_length;
    bVar1 = std::operator==(__x,__y);
    if (!bVar1) {
      __assert_fail("name == var->name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/apply-names.cc"
                    ,0x8f,
                    "void wabt::(anonymous namespace)::NameApplier::UseNameForVar(std::string_view, Var *)"
                   );
    }
  }
  else if (this != (NameApplier *)0x0) {
    name_00._M_str = __x._M_str;
    name_00._M_len = (size_t)this;
    Var::set_name(this_00,name_00);
    return;
  }
  return;
}

Assistant:

void NameApplier::UseNameForVar(std::string_view name, Var* var) {
  if (var->is_name()) {
    assert(name == var->name());
    return;
  }

  if (!name.empty()) {
    var->set_name(name);
  }
}